

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

void __thiscall mserialize::cx_string<25UL>::cx_string(cx_string<25UL> *this,char *str)

{
  size_t i;
  long lVar1;
  
  this->_data[10] = '\0';
  this->_data[0xb] = '\0';
  this->_data[0xc] = '\0';
  this->_data[0xd] = '\0';
  this->_data[0xe] = '\0';
  this->_data[0xf] = '\0';
  this->_data[0x10] = '\0';
  this->_data[0x11] = '\0';
  this->_data[0x12] = '\0';
  this->_data[0x13] = '\0';
  this->_data[0x14] = '\0';
  this->_data[0x15] = '\0';
  this->_data[0x16] = '\0';
  this->_data[0x17] = '\0';
  this->_data[0x18] = '\0';
  this->_data[0x19] = '\0';
  this->_data[0] = '\0';
  this->_data[1] = '\0';
  this->_data[2] = '\0';
  this->_data[3] = '\0';
  this->_data[4] = '\0';
  this->_data[5] = '\0';
  this->_data[6] = '\0';
  this->_data[7] = '\0';
  this->_data[8] = '\0';
  this->_data[9] = '\0';
  this->_data[10] = '\0';
  this->_data[0xb] = '\0';
  this->_data[0xc] = '\0';
  this->_data[0xd] = '\0';
  this->_data[0xe] = '\0';
  this->_data[0xf] = '\0';
  for (lVar1 = 0; lVar1 != 0x19; lVar1 = lVar1 + 1) {
    this->_data[lVar1] = str[lVar1];
  }
  return;
}

Assistant:

explicit constexpr cx_string(const char* str)
    :_data{0}
  {
    #if defined(__GNUC__) && !defined(__clang__)
      // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=96742
      #pragma GCC diagnostic push
      #pragma GCC diagnostic ignored "-Wtype-limits"
    #endif
    for (std::size_t i = 0; i < N; ++i)
    {
      _data[i] = str[i];
    }
    #if defined(__GNUC__) && !defined(__clang__)
      #pragma GCC diagnostic pop
    #endif
  }